

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

string * __thiscall
Dependency::getInstallPath_abi_cxx11_(string *__return_storage_ptr__,Dependency *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  Settings::destFolder_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&bStack_38,&this->new_name);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Dependency::getInstallPath()
{
    return Settings::destFolder() + new_name;
}